

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O2

error_info * __thiscall
toml::make_error_info<toml::source_location,char_const(&)[25]>
          (error_info *__return_storage_ptr__,toml *this,string *title,source_location *loc,
          string *msg,source_location *tail,char (*tail_1) [25])

{
  error_info ei;
  allocator<char> local_249;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  error_info local_1c8;
  error_info local_170;
  source_location local_118;
  source_location local_a0;
  
  std::__cxx11::string::string
            (&local_208,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::source_location(&local_118,(source_location *)title);
  std::__cxx11::string::string
            (&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"",&local_249);
  error_info::error_info(&local_1c8,(string *)&local_208,&local_118,(string *)&local_228,&local_248)
  ;
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  source_location::~source_location(&local_118);
  std::__cxx11::string::~string((string *)&local_208);
  error_info::error_info(&local_170,&local_1c8);
  source_location::source_location(&local_a0,(source_location *)msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,&tail->is_ok_,&local_249);
  detail::make_error_info_rec<>(__return_storage_ptr__,&local_170,&local_a0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  source_location::~source_location(&local_a0);
  error_info::~error_info(&local_170);
  error_info::~error_info(&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}